

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

fdb_status fdb_iterator_close(fdb_iterator *iterator)

{
  fdb_status fVar1;
  long *in_RDI;
  fdb_status fs;
  fdb_kvs_handle *in_stack_ffffffffffffffd8;
  hbtrie_iterator *in_stack_ffffffffffffffe0;
  fdb_status local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    if (in_RDI[1] != 0) {
      hbtrie_iterator_free(in_stack_ffffffffffffffe0);
      free((void *)in_RDI[1]);
    }
    if (in_RDI[2] != 0) {
      btree_iterator_free((btree_iterator *)in_stack_ffffffffffffffe0);
      free((void *)in_RDI[2]);
    }
    if (in_RDI[3] != 0) {
      hbtrie_iterator_free(in_stack_ffffffffffffffe0);
      free((void *)in_RDI[3]);
    }
    if (in_RDI[9] != 0) {
      free((void *)in_RDI[9]);
    }
    if (in_RDI[0xb] != 0) {
      free((void *)in_RDI[0xb]);
    }
    *(int *)(*in_RDI + 0x1e0) = *(int *)(*in_RDI + 0x1e0) + -1;
    wal_itr_close((wal_iterator *)0x15c7ba);
    if (((*(byte *)((long)in_RDI + 0x6c) & 1) == 0) &&
       (fVar1 = fdb_kvs_close(in_stack_ffffffffffffffd8), fVar1 != FDB_RESULT_SUCCESS)) {
      fdb_log_impl((err_log_callback *)(*in_RDI + 0x168),2,(fdb_status)(ulong)(uint)fVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                   ,"fdb_iterator_close",0x8ea,
                   "Failed to close the KV Store from a database file \'%s\' as part of closing the iterator"
                   ,**(undefined8 **)(*in_RDI + 0x48));
    }
    free((void *)in_RDI[0xe]);
    free(in_RDI);
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_close(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    LATENCY_STAT_START();
    if (iterator->hbtrie_iterator) {
        hbtrie_iterator_free(iterator->hbtrie_iterator);
        free(iterator->hbtrie_iterator);
    }

    if (iterator->seqtree_iterator) {
        btree_iterator_free(iterator->seqtree_iterator);
        free(iterator->seqtree_iterator);
    }
    if (iterator->seqtrie_iterator) {
        hbtrie_iterator_free(iterator->seqtrie_iterator);
        free(iterator->seqtrie_iterator);
    }

    if (iterator->start_key) {
        free(iterator->start_key);
    }

    if (iterator->end_key) {
        free(iterator->end_key);
    }

    --iterator->handle->num_iterators; // Decrement the iterator counter of the KV handle
    wal_itr_close(iterator->wal_itr);

    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_CLOSE);

    if (!iterator->snapshot_handle) {
        // Close the opened handle in the iterator,
        // if the handle is not for snapshot.
        fdb_status fs = fdb_kvs_close(iterator->handle);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(&iterator->handle->log_callback, FDB_LOG_ERROR, fs,
                    "Failed to close the KV Store from a database file '%s' as "
                    "part of closing the iterator",
                    iterator->handle->file->filename);
        }
    }

    free(iterator->_key);
    free(iterator);
    return FDB_RESULT_SUCCESS;
}